

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O1

char * debug_varname(GCproto *pt,BCPos pc,BCReg slot)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  uint32_t uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  char *unaff_R15;
  bool bVar8;
  char *p;
  byte *local_40;
  uint local_38;
  BCReg local_34;
  
  local_40 = (byte *)(ulong)(pt->varinfo).ptr32;
  if (local_40 != (byte *)0x0) {
    local_38 = 0;
    local_34 = slot;
    do {
      pbVar3 = local_40;
      bVar1 = *local_40;
      if (bVar1 < 7) {
        if (bVar1 != 0) goto LAB_0010cdf3;
LAB_0010ce18:
        iVar5 = 2;
LAB_0010ce1d:
        bVar2 = false;
      }
      else {
        do {
          local_40 = local_40 + 1;
        } while (*local_40 != 0);
LAB_0010cdf3:
        local_40 = local_40 + 1;
        uVar4 = lj_buf_ruleb128((char **)&local_40);
        uVar7 = local_38 + uVar4;
        local_38 = uVar7;
        if (pc < uVar7) goto LAB_0010ce18;
        uVar4 = lj_buf_ruleb128((char **)&local_40);
        bVar2 = true;
        if ((pc < uVar4 + uVar7) && (bVar8 = local_34 == 0, local_34 = local_34 - 1, bVar8)) {
          iVar5 = 1;
          if (6 < bVar1) {
            bVar2 = false;
            unaff_R15 = (char *)pbVar3;
            goto LAB_0010ce6e;
          }
          iVar6 = bVar1 - 1;
          if (iVar6 == 0) {
            bVar2 = false;
            unaff_R15 = "(for index)";
            goto LAB_0010ce6e;
          }
          unaff_R15 = "(for index)";
          do {
            do {
              bVar1 = *unaff_R15;
              unaff_R15 = (char *)((byte *)unaff_R15 + 1);
            } while (bVar1 != 0);
            iVar6 = iVar6 + -1;
          } while (iVar6 != 0);
          goto LAB_0010ce1d;
        }
        iVar5 = 0;
      }
LAB_0010ce6e:
    } while (iVar5 == 0);
    if ((iVar5 != 2) && (!bVar2)) {
      return (char *)(byte *)unaff_R15;
    }
  }
  return (char *)0x0;
}

Assistant:

static const char *debug_varname(const GCproto *pt, BCPos pc, BCReg slot)
{
  const char *p = (const char *)proto_varinfo(pt);
  if (p) {
    BCPos lastpc = 0;
    for (;;) {
      const char *name = p;
      uint32_t vn = *(const uint8_t *)p;
      BCPos startpc, endpc;
      if (vn < VARNAME__MAX) {
	if (vn == VARNAME_END) break;  /* End of varinfo. */
      } else {
	do { p++; } while (*(const uint8_t *)p);  /* Skip over variable name. */
      }
      p++;
      lastpc = startpc = lastpc + lj_buf_ruleb128(&p);
      if (startpc > pc) break;
      endpc = startpc + lj_buf_ruleb128(&p);
      if (pc < endpc && slot-- == 0) {
	if (vn < VARNAME__MAX) {
#define VARNAMESTR(name, str)	str "\0"
	  name = VARNAMEDEF(VARNAMESTR);
#undef VARNAMESTR
	  if (--vn) while (*name++ || --vn) ;
	}
	return name;
      }
    }
  }
  return NULL;
}